

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::visitStructRMW(OptimizeInstructions *this,StructRMW *curr)

{
  Expression **input;
  MemoryOrder MVar1;
  uintptr_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Type this_00;
  bool bVar6;
  Shareability SVar7;
  Index index;
  Index IVar8;
  Index index_00;
  BinaryOp BVar9;
  Expression *pEVar10;
  int64_t iVar11;
  Drop *this_01;
  StructGet *pSVar12;
  Block *rep;
  Expression *pEVar13;
  Binary *this_02;
  StructSet *this_03;
  ulong extraout_RDX;
  Op op;
  Type in_R8;
  optional<wasm::Type> type;
  anon_union_16_6_1532cd5a_for_Literal_0 local_90;
  Expression *local_78;
  undefined1 local_70 [8];
  Literal val;
  Builder local_38;
  Builder builder;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar6 = trapOnNull(this,(Expression *)curr,input);
  if (bVar6) {
    return;
  }
  bVar6 = wasm::Type::isStruct(&(*input)->type);
  if (!bVar6) {
    return;
  }
  local_70 = (undefined1  [8])wasm::Type::getHeapType(&(*input)->type);
  SVar7 = HeapType::getShared((HeapType *)local_70);
  if ((SVar7 == Shared) && (curr->order == SeqCst)) {
    return;
  }
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  pEVar10 = getFallthrough(this,curr->value);
  bVar6 = Properties::isSingleConstantExpression(pEVar10);
  if (bVar6) {
    Properties::getLiteral((Literal *)local_70,pEVar10);
    if (curr->op < RMWXchg) {
      if (curr->op == RMWAnd) {
        Literal::makeNegOne((Literal *)&local_90.func,
                            (Type)val.field_0.gcData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
        bVar6 = Literal::operator==((Literal *)local_70,(Literal *)&local_90.func);
        Literal::~Literal((Literal *)&local_90.func);
      }
      else {
        iVar11 = Literal::getInteger((Literal *)local_70);
        bVar6 = iVar11 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6 == false) {
      Literal::~Literal((Literal *)local_70);
    }
    else {
      IVar8 = curr->index;
      pEVar10 = curr->ref;
      pEVar13 = curr->value;
      this_01 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      this_01->value = pEVar13;
      Drop::finalize(this_01);
      in_R8.id = (uintptr_t)
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options;
      local_78 = getResultOfFirst(pEVar10,(Expression *)this_01,
                                  (this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .currFunction,
                                  (this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .currModule,(PassOptions *)in_R8.id);
      MVar1 = curr->order;
      uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
      pSVar12 = (StructGet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pSVar12->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression._id =
           StructGetId;
      pSVar12->signed_ = false;
      pSVar12->index = IVar8;
      pSVar12->ref = local_78;
      (pSVar12->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id = uVar2
      ;
      pSVar12->order = MVar1;
      StructGet::finalize(pSVar12);
      replaceCurrent(this,(Expression *)pSVar12);
      Literal::~Literal((Literal *)local_70);
      if (bVar6 != false) {
        return;
      }
    }
  }
  local_70 = (undefined1  [8])wasm::Type::getHeapType(&(*input)->type);
  SVar7 = HeapType::getShared((HeapType *)local_70);
  if (SVar7 == Shared) {
    return;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (curr->ref->type).id;
  index = Builder::addVar((Builder *)
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .currFunction,(Function *)0x0,(Name)(auVar3 << 0x40),in_R8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id
  ;
  IVar8 = Builder::addVar((Builder *)
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .currFunction,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id
  ;
  index_00 = Builder::addVar((Builder *)
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currFunction,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
  local_70 = (undefined1  [8])Builder::makeLocalSet(&local_38,index,curr->ref);
  val.type.id._0_4_ = IVar8;
  val.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)Builder::makeLocalSet(&local_38,IVar8,curr->value);
  IVar8 = curr->index;
  uVar2 = (curr->ref->type).id;
  pEVar10 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar10->_id = LocalGetId;
  local_78 = (Expression *)CONCAT44(local_78._4_4_,index);
  *(Index *)(pEVar10 + 1) = index;
  (pEVar10->type).id = uVar2;
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  pSVar12 = (StructGet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pSVar12->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression._id = StructGetId;
  pSVar12->signed_ = false;
  pSVar12->order = Unordered;
  pSVar12->index = IVar8;
  pSVar12->ref = pEVar10;
  (pSVar12->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id = uVar2;
  StructGet::finalize(pSVar12);
  val.field_0.func.super_IString.str._M_str =
       (char *)Builder::makeLocalSet(&local_38,index_00,(Expression *)pSVar12);
  local_90.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70;
  local_90.func.super_IString.str._M_str = (char *)0x3;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  rep = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                  (&local_38,(initializer_list<wasm::Expression_*> *)&local_90.func,type);
  switch(curr->op) {
  case RMWSub:
    op = Sub;
    break;
  case RMWAnd:
    op = And;
    break;
  case RMWOr:
    op = Or;
    break;
  case RMWXor:
    op = Xor;
    break;
  case RMWXchg:
    uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
    this_02 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = LocalGetId;
    this_02->op = (BinaryOp)val.type.id;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = uVar2;
    goto LAB_009e1898;
  default:
    op = Add;
  }
  BVar9 = Abstract::getBinary((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                    super_Expression.type.id,op);
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  pEVar10 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar10->_id = LocalGetId;
  *(Index *)(pEVar10 + 1) = index_00;
  (pEVar10->type).id = uVar2;
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  pEVar13 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar13->_id = LocalGetId;
  *(BinaryOp *)(pEVar13 + 1) = (BinaryOp)val.type.id;
  (pEVar13->type).id = uVar2;
  this_02 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_02->op = BVar9;
  this_02->left = pEVar10;
  this_02->right = pEVar13;
  Binary::finalize(this_02);
LAB_009e1898:
  val.type.id = (uintptr_t)&rep->list;
  IVar8 = curr->index;
  uVar2 = (curr->ref->type).id;
  pEVar10 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar10->_id = LocalGetId;
  *(undefined4 *)(pEVar10 + 1) = local_78._0_4_;
  (pEVar10->type).id = uVar2;
  this_03 = (StructSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
  (this_03->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id = StructSetId;
  (this_03->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.id = 0;
  this_03->order = Unordered;
  this_03->index = IVar8;
  this_03->ref = pEVar10;
  this_03->value = (Expression *)this_02;
  StructSet::finalize(this_03);
  this_00 = val.type;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)val.type.id,
             (Expression *)this_03);
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  pEVar10 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar10->_id = LocalGetId;
  *(Index *)(pEVar10 + 1) = index_00;
  (pEVar10->type).id = uVar2;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00.id,
             pEVar10);
  (rep->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
       (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  replaceCurrent(this,(Expression *)rep);
  return;
}

Assistant:

void visitStructRMW(StructRMW* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (!curr->ref->type.isStruct()) {
      return;
    }

    // We generally can't optimize seqcst RMWs on shared memory because they can
    // act as both the source and sink of synchronization edges, even if they
    // don't modify the in-memory value.
    if (curr->ref->type.getHeapType().isShared() &&
        curr->order == MemoryOrder::SeqCst) {
      return;
    }

    Builder builder(*getModule());

    // This RMW is either to non-shared memory or has acquire-release ordering.
    // In the former case, it trivially does not synchronize with other threads
    // and we can optimize to our heart's content. In the latter case, if we
    // know the RMW does not change the value in memory, then we can consider
    // all subsequent reads as reading from the previous write rather than from
    // this RMW op, which means this RMW does not synchronize with later reads
    // and we can optimize out the write part. This optimization wouldn't be
    // valid for sequentially consistent RMW ops because the next reads from
    // this location in the total order of seqcst ops would have to be
    // considered to be reading from this RMW and therefore would synchronize
    // with it.
    auto* value = getFallthrough(curr->value);
    if (Properties::isSingleConstantExpression(value)) {
      auto val = Properties::getLiteral(value);
      bool canOptimize = false;
      switch (curr->op) {
        case RMWAdd:
        case RMWSub:
        case RMWOr:
        case RMWXor:
          canOptimize = val.getInteger() == 0;
          break;
        case RMWAnd:
          canOptimize = val == Literal::makeNegOne(val.type);
          break;
        case RMWXchg:
          canOptimize = false;
          break;
      }
      if (canOptimize) {
        replaceCurrent(builder.makeStructGet(
          curr->index,
          getResultOfFirst(curr->ref, builder.makeDrop(curr->value)),
          curr->order,
          curr->type));
        return;
      }
    }

    // No further optimizations possible on RMWs to shared memory.
    if (curr->ref->type.getHeapType().isShared()) {
      return;
    }

    // Lower the RMW to its more basic operations. Breaking the atomic
    // operation into several non-atomic operations is safe because no other
    // thread can observe an intermediate state in the unshared memory. This
    // initially increases code size, but the more basic operations may be
    // more optimizable than the original RMW.
    // TODO: Experiment to determine whether this is worthwhile on real code.
    // Maybe we should do this optimization only when optimizing for speed over
    // size.
    auto ref = builder.addVar(getFunction(), curr->ref->type);
    auto val = builder.addVar(getFunction(), curr->type);
    auto result = builder.addVar(getFunction(), curr->type);
    auto* block = builder.makeBlock(
      {builder.makeLocalSet(ref, curr->ref),
       builder.makeLocalSet(val, curr->value),
       builder.makeLocalSet(
         result,
         builder.makeStructGet(curr->index,
                               builder.makeLocalGet(ref, curr->ref->type),
                               MemoryOrder::Unordered,
                               curr->type))});
    Expression* newVal = nullptr;
    if (curr->op == RMWXchg) {
      newVal = builder.makeLocalGet(val, curr->type);
    } else {
      Abstract::Op binop = Abstract::Add;
      switch (curr->op) {
        case RMWAdd:
          binop = Abstract::Add;
          break;
        case RMWSub:
          binop = Abstract::Sub;
          break;
        case RMWAnd:
          binop = Abstract::And;
          break;
        case RMWOr:
          binop = Abstract::Or;
          break;
        case RMWXor:
          binop = Abstract::Xor;
          break;
        case RMWXchg:
          WASM_UNREACHABLE("unexpected op");
      }
      newVal = builder.makeBinary(Abstract::getBinary(curr->type, binop),
                                  builder.makeLocalGet(result, curr->type),
                                  builder.makeLocalGet(val, curr->type));
    }
    block->list.push_back(
      builder.makeStructSet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            newVal,
                            MemoryOrder::Unordered));

    block->list.push_back(builder.makeLocalGet(result, curr->type));
    block->type = curr->type;
    replaceCurrent(block);
  }